

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O0

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  uint32_t local_68 [2];
  uint32_t l [16];
  secp256k1_scalar *b_local;
  secp256k1_scalar *a_local;
  secp256k1_scalar *r_local;
  
  secp256k1_scalar_mul_512(local_68,a,b);
  secp256k1_scalar_reduce_512(r,local_68);
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint32_t l[16];
    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);
}